

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoMeshBuilder.cpp
# Opt level: O0

TPZGeoEl *
TPZGeoMeshBuilder::InsertElement
          (TPZGeoMesh *gmesh,int *physical_identifier,int *el_type,int *el_identifier,
          vector<int,_std::allocator<int>_> *node_identifiers)

{
  size_type sVar1;
  reference pvVar2;
  long *plVar3;
  int *in_RCX;
  undefined4 *in_RDX;
  vector<int,_std::allocator<int>_> *in_R8;
  TPZGeoEl *gel;
  int k_node;
  int n_nodes;
  TPZManVector<long,_15> Topology;
  size_t in_stack_00000298;
  char *in_stack_000002a0;
  TPZManVector<long,_15> *in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe98;
  TPZGeoMesh *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  int iVar4;
  TPZGeoMesh *in_stack_fffffffffffffeb0;
  int64_t in_stack_fffffffffffffeb8;
  TPZManVector<long,_15> *in_stack_fffffffffffffec0;
  int64_t in_stack_fffffffffffffec8;
  TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *in_stack_fffffffffffffed0;
  TPZGeoElRefPattern<pzgeom::TPZGeoCube> *local_e8;
  int local_e0;
  TPZVec<long> local_c0 [4];
  vector<int,_std::allocator<int>_> *local_28;
  int *local_20;
  undefined4 *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  TPZManVector<long,_15>::TPZManVector
            ((TPZManVector<long,_15> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(local_28);
  TPZManVector<long,_15>::Resize
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(long *)in_stack_fffffffffffffeb0);
  for (local_e0 = 0; iVar4 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20), local_e0 < (int)sVar1;
      local_e0 = local_e0 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_e0);
    iVar4 = *pvVar2;
    plVar3 = TPZVec<long>::operator[](local_c0,(long)local_e0);
    *plVar3 = (long)(iVar4 + -1);
  }
  local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)0x0;
  *local_20 = *local_20 + -1;
  switch(*local_18) {
  case 1:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(200);
    TPZGeoElRefPattern<pzgeom::TPZGeoLinear>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 2:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x130);
    TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 3:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x168);
    TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 4:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x1f8);
    TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 5:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x338);
    TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
              (local_e8,in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 6:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x298);
    TPZGeoElRefPattern<pzgeom::TPZGeoPrism>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoPrism> *)in_stack_fffffffffffffed0,
               (int64_t)local_e8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 7:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x260);
    TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,(TPZVec<long> *)local_e8,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 8:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0xd0);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticLine>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticLine> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)local_e8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 9:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x148);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(TPZGeoMesh *)local_e8);
    break;
  case 10:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x188);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticQuad>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticQuad> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 0xb:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x228);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 0xc:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x398);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticCube>::TPZGeoElRefPattern
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               &in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  case 0xd:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x2e0);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticPrism>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticPrism> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->super_TPZVec<long>,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    break;
  default:
    in_stack_fffffffffffffe80 =
         (TPZManVector<long,_15> *)
         std::operator<<((ostream *)&std::cout,"Element not impelemented.");
    std::ostream::operator<<(in_stack_fffffffffffffe80,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_000002a0,in_stack_00000298);
    break;
  case 0xf:
    local_e8 = (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)operator_new(0x70);
    TPZGeoElement<pzgeom::TPZGeoPoint,_pzrefine::TPZRefPoint>::TPZGeoElement
              ((TPZGeoElement<pzgeom::TPZGeoPoint,_pzrefine::TPZRefPoint> *)
               in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (TPZVec<long> *)in_stack_fffffffffffffeb0,iVar4,in_stack_fffffffffffffea0);
  }
  TPZManVector<long,_15>::~TPZManVector(in_stack_fffffffffffffe80);
  return (TPZGeoEl *)local_e8;
}

Assistant:

TPZGeoEl* TPZGeoMeshBuilder::InsertElement(TPZGeoMesh * gmesh, int & physical_identifier, int & el_type, int & el_identifier, std::vector<int> & node_identifiers){
    
    TPZManVector <int64_t,15> Topology;
    int n_nodes = node_identifiers.size();
    Topology.Resize(n_nodes, 0);
    for (int k_node = 0; k_node<n_nodes; k_node++) {
        Topology[k_node] = node_identifiers[k_node]-1;
    }
    TPZGeoEl* gel = nullptr;
    el_identifier--;
    switch (el_type) {
        case 1:
        {   // Line
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoLinear> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 2:
        {
            // Triangle
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoTriangle> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 3:
        {
            // Quadrilateral
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoQuad> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 4:
        {
            // Tetrahedron
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoTetrahedra> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 5:
        {
            // Hexahedra
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoCube> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 6:
        {
            // Prism
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoPrism> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 7:
        {
            // Pyramid
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoPyramid> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 8:
        {
            // Quadratic Line
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticLine> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 9:
        {
            // Triangle
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticTrig> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 10:
        {
            // Quadrilateral
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticQuad> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 11:
        {
            // Tetrahedron
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticTetra> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 12:
        {
            // Hexahedra
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticCube> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 13:
        {
            // Prism
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticPrism> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 15:{
            // Point
            gel = new TPZGeoElement< pzgeom::TPZGeoPoint, pzrefine::TPZRefPoint> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        default:
        {
            std::cout << "Element not impelemented." << std::endl;
            DebugStop();
        }
            break;
    }
    return gel;
}